

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

char * Prs_CreateDetectRamPort(Prs_Ntk_t *pNtk,Vec_Int_t *vBox,int NameRamId)

{
  Abc_Nam_t *p;
  int iVar1;
  int Lit;
  char *pcVar2;
  int iVar3;
  
  iVar3 = 1;
  do {
    if (vBox->nSize <= iVar3) {
      return (char *)0x0;
    }
    iVar1 = Vec_IntEntry(vBox,iVar3 + -1);
    Lit = Vec_IntEntry(vBox,iVar3);
    iVar3 = iVar3 + 2;
  } while (iVar1 != NameRamId);
  p = pNtk->pStrs;
  iVar3 = Abc_Lit2Var2(Lit);
  pcVar2 = Abc_NamStr(p,iVar3);
  return pcVar2;
}

Assistant:

char * Prs_CreateDetectRamPort( Prs_Ntk_t * pNtk, Vec_Int_t * vBox, int NameRamId )
{
    int i, FormId, ActId;
    Vec_IntForEachEntryDouble( vBox, FormId, ActId, i )
        if ( FormId == NameRamId )
            return Abc_NamStr(pNtk->pStrs, Abc_Lit2Var2(ActId));
    return NULL;
}